

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

void duckdb::CheckDistinctnessInternal
               (ValidityMask *valid,vector<std::reference_wrapper<duckdb::Vector>,_true> *sort_keys,
               idx_t count,
               map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
               *result)

{
  pointer prVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  reference_wrapper<duckdb::Vector> *sort_key;
  pointer prVar4;
  bool bVar5;
  vector<std::reference_wrapper<duckdb::Vector>,_true> *__range3;
  ulong local_48;
  idx_t local_40;
  map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
  *local_38;
  
  local_48 = 0;
  local_38 = result;
  do {
    if (count <= local_48) {
      return;
    }
    bVar5 = false;
    local_40 = local_48;
LAB_019ff82a:
    local_48 = local_48 + 1;
    if (local_48 < count) {
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&valid->super_TemplatedValidityMask<unsigned_long>,local_48);
      if (bVar3) {
        prVar4 = (sort_keys->
                 super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        prVar1 = (sort_keys->
                 super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (prVar4 == prVar1) {
            this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ::std::
                   map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
                   ::operator[](local_38,&local_40);
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this,&local_48);
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&valid->super_TemplatedValidityMask<unsigned_long>,local_48);
            bVar5 = true;
            break;
          }
          pdVar2 = prVar4->_M_data->data;
          bVar3 = string_t::operator!=
                            ((string_t *)(pdVar2 + local_40 * 0x10),
                             (string_t *)(pdVar2 + local_48 * 0x10));
          prVar4 = prVar4 + 1;
        } while (!bVar3);
      }
      goto LAB_019ff82a;
    }
    if (bVar5) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&valid->super_TemplatedValidityMask<unsigned_long>,local_40);
    }
    local_48 = local_40 + 1;
  } while( true );
}

Assistant:

static void CheckDistinctnessInternal(ValidityMask &valid, vector<reference<Vector>> &sort_keys, idx_t count,
                                      map<idx_t, vector<idx_t>> &result) {
	for (idx_t i = 0; i < count; i++) {
		bool has_conflicts = false;
		for (idx_t j = i + 1; j < count; j++) {
			if (!valid.RowIsValid(j)) {
				// Already a conflict
				continue;
			}
			bool matches = true;
			for (auto &sort_key : sort_keys) {
				auto &this_row = FlatVector::GetData<string_t>(sort_key.get())[i];
				auto &other_row = FlatVector::GetData<string_t>(sort_key.get())[j];
				if (this_row != other_row) {
					matches = false;
					break;
				}
			}
			if (matches) {
				auto &row_ids = result[i];
				has_conflicts = true;
				row_ids.push_back(j);
				valid.SetInvalid(j);
			}
		}
		if (has_conflicts) {
			valid.SetInvalid(i);
		}
	}
}